

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O1

switch_strings * __thiscall
pstore::command_line::details::get_switch_strings_abi_cxx11_
          (switch_strings *__return_storage_ptr__,details *this,options_set *ops)

{
  _Rb_tree_header *p_Var1;
  ulong new_elements;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *str_00;
  ulong uVar2;
  int iVar3;
  string *str_01;
  size_t sVar4;
  czstring str_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined4 extraout_var_00;
  mapped_type *sm;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ptVar6;
  _Rb_tree_node_base *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char cVar9;
  long lVar10;
  char separator [3];
  string str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  name;
  char local_b4 [4];
  undefined1 local_b0 [8];
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  switch_strings *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Rb_tree_node_base *local_38;
  undefined4 extraout_var;
  
  local_b4[2] = 0;
  local_b4[0] = ',';
  local_b4[1] = ' ';
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = *(_Rb_tree_node_base **)(this + 0x18);
  local_38 = (_Rb_tree_node_base *)(this + 8);
  local_88 = __return_storage_ptr__;
  if (p_Var7 != local_38) {
    do {
      this_00 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(p_Var7 + 1);
      str_01 = option::name_abi_cxx11_((option *)this_00);
      sVar4 = utf::length(str_01);
      local_b0 = (undefined1  [8])&local_a0;
      local_a8 = (char *)0x0;
      local_a0._M_local_buf[0] = '\0';
      if (sVar4 < 2) {
        std::operator+(&local_58,"-",str_01);
        std::__cxx11::string::operator=((string *)local_b0,(string *)&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        lVar10 = 1;
      }
      else {
        std::operator+(&local_58,"--",str_01);
        std::__cxx11::string::operator=((string *)local_b0,(string *)&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        lVar10 = 2;
      }
      iVar3 = (**(code **)(this_00->_M_allocated_capacity + 0x70))(this_00);
      if ((char)iVar3 == '\0') {
        str_02 = (czstring)0x0;
      }
      else {
        iVar3 = (**(code **)(this_00->_M_allocated_capacity + 0x88))(this_00);
        str_02 = (czstring)CONCAT44(extraout_var,iVar3);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(sVar4 + lVar10);
      if (str_02 != (czstring)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x2 < paVar8) {
          std::__cxx11::string::append((char *)local_b0);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)paVar8 + 1);
        }
        cVar9 = (char)(string *)local_b0;
        std::__cxx11::string::push_back(cVar9);
        std::__cxx11::string::append((char *)local_b0);
        std::__cxx11::string::push_back(cVar9);
        sVar4 = utf::length(str_02);
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar8->_M_local_buf + sVar4 + 2);
      }
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)utf::length((string *)local_b0);
      if (paVar5 != paVar8) {
        assert_failed("pstore::utf::length (str) == code_points",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                      ,0x56);
      }
      local_80._M_allocated_capacity = (size_type)&local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_b0,local_a8 + (long)local_b0);
      local_60 = paVar8;
      if (local_b0 != (undefined1  [8])&local_a0) {
        operator_delete((void *)local_b0,
                        CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1)
        ;
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)utf::length((string *)&local_80);
      if (paVar8 != local_60) {
        assert_failed("pstore::utf::length (std::get<std::string> (name)) == std::get<std::size_t> (name)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                      ,0x8b);
      }
      iVar3 = (**(code **)(this_00->_M_allocated_capacity + 0x60))(this_00);
      if (CONCAT44(extraout_var_00,iVar3) != 0) {
        this_00 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(CONCAT44(extraout_var_00,iVar3) + 0x88);
      }
      local_b0 = (undefined1  [8])this_00;
      pstore::gsl::not_null<const_pstore::command_line::option_*>::ensure_invariant
                ((not_null<const_pstore::command_line::option_*> *)local_b0);
      sm = std::
           map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
           ::operator[](local_88,(key_type *)local_b0);
      if (sm->elements_ == 0) {
LAB_00116c83:
        local_b0 = (undefined1  [8])local_60;
        local_a8 = local_a0._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_80._M_allocated_capacity,
                   local_80._8_8_ + local_80._M_allocated_capacity);
        uVar2 = sm->elements_;
        new_elements = uVar2 + 1;
        if (new_elements < 2) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(&sm->small_buffer_)[uVar2]._M_elems[0].
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    );
          (&sm->small_buffer_)[uVar2]._M_elems[0].
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          .super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
          _M_head_impl = (unsigned_long)local_b0;
        }
        else {
          if (uVar2 < 2) {
            small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
            ::switch_to_big(sm,new_elements);
          }
          std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::push_back(&sm->big_buffer_,(value_type *)local_b0);
          sm->buffer_ = (sm->big_buffer_).
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
        }
        sm->elements_ = new_elements;
        if (local_a8 != local_a0._M_local_buf + 8) {
          operator_delete(local_a8,local_a0._8_8_ + 1);
        }
      }
      else {
        ptVar6 = small_vector<std::tuple<std::__cxx11::string,unsigned_long>,1ul>::
                 index<pstore::small_vector<std::tuple<std::__cxx11::string,unsigned_long>,1ul>&,std::tuple<std::__cxx11::string,unsigned_long>>
                           (sm,sm->elements_ - 1);
        if ((char *)0x14 <
            local_60->_M_local_buf +
            (ptVar6->
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
            ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
            _M_head_impl + 2) goto LAB_00116c83;
        std::operator+((string *)local_b0,local_b4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_80);
        str_00 = &(ptVar6->
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  ).
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ;
        std::__cxx11::string::_M_append((char *)str_00,(ulong)local_b0);
        if (local_b0 != (undefined1  [8])&local_a0) {
          operator_delete((void *)local_b0,
                          CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) +
                          1);
        }
        (ptVar6->
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
        _M_head_impl = (unsigned_long)
                       (local_60->_M_local_buf +
                       (ptVar6->
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                       ).super__Tuple_impl<1UL,_unsigned_long>.
                       super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + 2);
        sVar4 = utf::length(&str_00->_M_head_impl);
        if (sVar4 != (ptVar6->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                     ).super__Tuple_impl<1UL,_unsigned_long>.
                     super__Head_base<1UL,_unsigned_long,_false>._M_head_impl) {
          assert_failed("pstore::utf::length (prev_string) == prev_code_points",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                        ,0x9e);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_allocated_capacity != &local_70) {
        operator_delete((void *)local_80._M_allocated_capacity,local_70._M_allocated_capacity + 1);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_38);
  }
  return local_88;
}

Assistant:

auto get_switch_strings (options_set const & ops) -> switch_strings {
                    constexpr char const separator[] = ", ";
                    constexpr auto separator_len = array_elements (separator) - 1U;

                    switch_strings names;
                    for (option const * op : ops) {
                        std::pair<std::string, std::size_t> name = option_string (*op);
                        PSTORE_ASSERT (pstore::utf::length (std::get<std::string> (name)) ==
                                       std::get<std::size_t> (name));

                        if (alias const * const alias = op->as_alias ()) {
                            op = alias->original ();
                        }

                        auto & v = names[op];
                        if (!v.empty ()) {
                            auto & prev = v.back ();
                            auto & prev_string = std::get<std::string> (prev);
                            auto & prev_code_points = std::get<std::size_t> (prev);

                            if (prev_code_points + separator_len + std::get<std::size_t> (name) <=
                                overlong_opt_max) {
                                // Fold this string onto the same output line as its predecessor.
                                prev_string += separator + std::get<std::string> (name);
                                prev_code_points += separator_len + std::get<std::size_t> (name);

                                PSTORE_ASSERT (pstore::utf::length (prev_string) ==
                                               prev_code_points);
                                continue;
                            }
                        }
                        v.push_back (name);
                    }
                    return names;
                }